

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O2

void __thiscall
cursespp::AppLayout::SetLayout(AppLayout *this,shared_ptr<cursespp::LayoutBase> *layout)

{
  shared_ptr<cursespp::LayoutBase> *__r;
  element_type *peVar1;
  int iVar2;
  mapped_type *pmVar3;
  ITopLevelLayout *pIVar4;
  iterator iVar5;
  ulong uVar6;
  key_type local_58;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((layout->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      peVar1) {
    __r = &this->layout;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3c])();
      local_58 = &peVar1->super_ILayout;
      pmVar3 = std::
               map<cursespp::ILayout_*,_int,_std::less<cursespp::ILayout_*>,_std::allocator<std::pair<cursespp::ILayout_*const,_int>_>_>
               ::operator[](&lastFocusMap,&local_58);
      *pmVar3 = iVar2;
      std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cursespp::LayoutBase,void>
                (local_40,&__r->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>
                );
      (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x47])
                (this,local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      (*(((__r->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x2c])();
    }
    std::__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)
    ;
    pIVar4 = this->topLevelLayout;
    if (pIVar4 != (ITopLevelLayout *)0x0) {
      (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,0);
    }
    std::__shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&__r->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>,
               &layout->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>);
    ShortcutsWindow::RemoveAll
              ((this->shortcuts).
               super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      peVar1 = (layout->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      if (peVar1 == (element_type *)0x0) {
        this->topLevelLayout = (ITopLevelLayout *)0x0;
      }
      else {
        pIVar4 = (ITopLevelLayout *)
                 __dynamic_cast(peVar1,&LayoutBase::typeinfo,&ITopLevelLayout::typeinfo,
                                0xfffffffffffffffe);
        this->topLevelLayout = pIVar4;
        if (pIVar4 != (ITopLevelLayout *)0x0) {
          (**(code **)(*(long *)pIVar4 + 0x10))
                    (pIVar4,(this->shortcuts).
                            super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        }
      }
      std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cursespp::LayoutBase,void>
                (local_50,&__r->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>
                );
      (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x46])
                (this,local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x20])(peVar1,0);
      (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x44])
                (this);
      iVar2 = (*(((this->shortcuts).
                  super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x24])();
      if ((char)iVar2 == '\0') {
        peVar1 = (__r->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_58 = &peVar1->super_ILayout;
        if (peVar1 == (element_type *)0x0) {
          local_58 = (key_type)0x0;
        }
        iVar5 = std::
                _Rb_tree<cursespp::ILayout_*,_std::pair<cursespp::ILayout_*const,_int>,_std::_Select1st<std::pair<cursespp::ILayout_*const,_int>_>,_std::less<cursespp::ILayout_*>,_std::allocator<std::pair<cursespp::ILayout_*const,_int>_>_>
                ::find(&lastFocusMap._M_t,&local_58);
        if ((_Rb_tree_header *)iVar5._M_node == &lastFocusMap._M_t._M_impl.super__Rb_tree_header) {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          if (0 < (int)*(uint *)&iVar5._M_node[1]._M_parent) {
            uVar6 = (ulong)*(uint *)&iVar5._M_node[1]._M_parent;
          }
        }
        peVar1 = (__r->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3d])
                  (peVar1,uVar6,1);
      }
    }
  }
  return;
}

Assistant:

void AppLayout::SetLayout(std::shared_ptr<cursespp::LayoutBase> layout) {
    if (layout != this->layout) {
        if (this->layout) {
            last(this->layout.get(), this->layout->GetFocusIndex());
            this->RemoveWindow(this->layout);
            this->layout->Hide();
        }

        this->lastFocus.reset();

        if (this->topLevelLayout) {
            this->topLevelLayout->SetShortcutsWindow(nullptr);
        }

        this->layout = layout;
        this->shortcuts->RemoveAll();

        if (this->layout) {
            this->topLevelLayout = dynamic_cast<ITopLevelLayout*>(layout.get());
            if (this->topLevelLayout) {
                this->topLevelLayout->SetShortcutsWindow(this->shortcuts.get());
            }

            this->AddWindow(this->layout);
            this->layout->SetFocusOrder(0);
            this->Layout();

            if (!this->shortcuts->IsFocused()) {
                auto lastFocusIndex = std::max(0, last(this->layout.get()));
                this->layout->SetFocusIndex(lastFocusIndex);
            }
        }
    }
}